

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void fix_bind(xr_bone *bone)

{
  pointer ppxVar1;
  pointer ppxVar2;
  fmatrix local_i;
  fmatrix total_i;
  fmatrix parent_i;
  fmatrix local;
  _matrix<float> _Stack_1a8;
  _matrix<float> local_168;
  _matrix<float> local_128;
  _matrix<float> local_e8;
  _matrix<float> local_a8;
  _matrix<float> local_68;
  
  ppxVar1 = (bone->m_children).
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppxVar2 = (bone->m_children).
                 super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppxVar2 != ppxVar1; ppxVar2 = ppxVar2 + 1) {
    fix_bind(*ppxVar2);
  }
  if (bone->m_parent != (xr_bone *)0x0) {
    xray_re::_matrix<float>::set_xyz_i(&local_68,&bone->m_bind_rotate);
    local_68.field_0._48_8_ = *(undefined8 *)&(bone->m_bind_offset).field_0;
    local_68.field_0.field_0._43 = (bone->m_bind_offset).field_0.field_0.z;
    xray_re::_matrix<float>::set_xyz_i(&local_a8,&bone->m_parent->m_bind_rotate);
    local_a8.field_0._48_8_ = *(undefined8 *)&(bone->m_parent->m_bind_offset).field_0;
    local_a8.field_0.field_0._43 = (bone->m_parent->m_bind_offset).field_0.field_0.z;
    xray_re::_matrix<float>::invert_43(&local_128,&local_a8);
    xray_re::_matrix<float>::invert_43(&local_168,&local_68);
    xray_re::_matrix<float>::mul_43(&local_e8,&local_168,&local_a8);
    xray_re::_matrix<float>::invert_43(&_Stack_1a8,&local_e8);
    *(undefined8 *)&(bone->m_bind_offset).field_0 = _Stack_1a8.field_0._48_8_;
    (bone->m_bind_offset).field_0.field_0.z = _Stack_1a8.field_0.field_0._43;
    xray_re::_matrix<float>::get_xyz_i(&_Stack_1a8,&bone->m_bind_rotate);
  }
  return;
}

Assistant:

void fix_bind(xr_bone * bone)
{
	for (xr_bone_vec_it it = bone->children().begin(), end = bone->children().end(); it != end; ++it)
		fix_bind(*it);

	if (!bone->is_root())
	{
		fmatrix total, parent, local, parent_i, total_i, local_i;
		total.set_xyz_i(bone->bind_rotate());
		total.c.set(bone->bind_offset());
		parent.set_xyz_i(bone->parent()->bind_rotate());
		parent.c.set(bone->parent()->bind_offset());
		parent_i.invert_43(parent);
		total_i.invert_43(total);
		local.mul_43(total_i, parent);
		local_i.invert_43(local);

		bone->bind_offset() = local_i.c;
		local_i.get_xyz_i(bone->bind_rotate());
	}
}